

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O1

Gia_Man_t * Acb_NtkGiaDeriveMiter(Gia_Man_t *pOne,Gia_Man_t *pTwo,int Type)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  Gia_Man_t *p;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  ulong uVar12;
  ulong uVar13;
  Gia_Obj_t *pGVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int pLitsS [2];
  int pLitsF [2];
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  if (pOne->vCis->nSize != pTwo->vCis->nSize) {
    __assert_fail("Gia_ManCiNum(pOne) == Gia_ManCiNum(pTwo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                  ,400,"Gia_Man_t *Acb_NtkGiaDeriveMiter(Gia_Man_t *, Gia_Man_t *, int)");
  }
  iVar6 = pOne->vCos->nSize;
  if (iVar6 != pTwo->vCos->nSize) {
    __assert_fail("Gia_ManCoNum(pOne) == Gia_ManCoNum(pTwo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                  ,0x191,"Gia_Man_t *Acb_NtkGiaDeriveMiter(Gia_Man_t *, Gia_Man_t *, int)");
  }
  p = Gia_ManStart((iVar6 * 5) / 2 + pOne->nObjs + pTwo->nObjs);
  pcVar8 = (char *)malloc(6);
  builtin_strncpy(pcVar8,"miter",6);
  p->pName = pcVar8;
  p->pSpec = (char *)0x0;
  Gia_ManHashAlloc(p);
  pOne->pObjs->Value = 0;
  pTwo->pObjs->Value = 0;
  pVVar10 = pOne->vCis;
  uVar7 = pVVar10->nSize;
  uVar12 = (ulong)uVar7;
  if (0 < (int)uVar7) {
    lVar16 = 0;
    do {
      uVar7 = (uint)uVar12;
      iVar6 = pVVar10->pArray[lVar16];
      if (((long)iVar6 < 0) || (pOne->nObjs <= iVar6)) goto LAB_003acebf;
      pGVar14 = pOne->pObjs;
      if (pGVar14 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p);
      uVar12 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p->nObjs <= pGVar9)) {
LAB_003acefd:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p->nObjs <= pGVar9)) goto LAB_003acefd;
      pGVar14[iVar6].Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
      lVar16 = lVar16 + 1;
      pVVar10 = pOne->vCis;
      uVar7 = pVVar10->nSize;
      uVar12 = (ulong)(int)uVar7;
    } while (lVar16 < (long)uVar12);
  }
  uVar12 = (ulong)pTwo->vCis->nSize;
  if (0 < (long)uVar12) {
    piVar5 = pTwo->vCis->pArray;
    uVar15 = 0;
    uVar13 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar13 = uVar15;
    }
    do {
      iVar6 = piVar5[uVar15];
      if (((long)iVar6 < 0) || (pTwo->nObjs <= iVar6)) goto LAB_003acebf;
      if (pTwo->pObjs == (Gia_Obj_t *)0x0) break;
      if (uVar13 == uVar15) goto LAB_003acede;
      iVar1 = pVVar10->pArray[uVar15];
      if (((long)iVar1 < 0) || (pOne->nObjs <= iVar1)) goto LAB_003acebf;
      pTwo->pObjs[iVar6].Value = pOne->pObjs[iVar1].Value;
      uVar15 = uVar15 + 1;
    } while (uVar12 != uVar15);
  }
  if (0 < pOne->nObjs) {
    lVar16 = 8;
    lVar17 = 0;
    do {
      pGVar14 = pOne->pObjs;
      if (pGVar14 == (Gia_Obj_t *)0x0) break;
      uVar12 = *(ulong *)((long)pGVar14 + lVar16 + -8);
      if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
        uVar7 = *(uint *)((long)pGVar14 +
                         lVar16 + (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3);
        if (((int)uVar7 < 0) ||
           (uVar2 = *(uint *)((long)pGVar14 +
                             lVar16 + (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar2 < 0)) goto LAB_003acf1c;
        iVar6 = Gia_ManHashAnd(p,uVar7 ^ (uint)(uVar12 >> 0x1d) & 1,
                               uVar2 ^ (uint)(uVar12 >> 0x3d) & 1);
        *(int *)(&pGVar14->field_0x0 + lVar16) = iVar6;
      }
      lVar17 = lVar17 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar17 < pOne->nObjs);
  }
  iVar6 = pTwo->nObjs;
  if ((0 < iVar6) && (pGVar14 = pTwo->pObjs, pGVar14 != (Gia_Obj_t *)0x0)) {
    lVar16 = 0;
    do {
      uVar12 = *(ulong *)pGVar14;
      if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
        if ((int)pGVar14[-(uVar12 & 0x1fffffff)].Value < 0) goto LAB_003acf1c;
        uVar7 = (uint)(uVar12 >> 0x20);
        if ((int)pGVar14[-(ulong)(uVar7 & 0x1fffffff)].Value < 0) goto LAB_003acf1c;
        uVar7 = Gia_ManHashAnd(p,pGVar14[-(uVar12 & 0x1fffffff)].Value ^ (uint)(uVar12 >> 0x1d) & 1,
                               pGVar14[-(ulong)(uVar7 & 0x1fffffff)].Value ^ uVar7 >> 0x1d & 1);
        pGVar14->Value = uVar7;
      }
      lVar16 = lVar16 + 1;
      iVar6 = pTwo->nObjs;
    } while ((lVar16 < iVar6) && (pGVar14 = pTwo->pObjs + lVar16, pTwo->pObjs != (Gia_Obj_t *)0x0));
  }
  lVar16 = (long)pOne->vCos->nSize;
  if (0 < lVar16) {
    piVar5 = pOne->vCos->pArray;
    lVar17 = 0;
    do {
      iVar1 = piVar5[lVar17];
      if (((long)iVar1 < 0) || (pOne->nObjs <= iVar1)) goto LAB_003acebf;
      if (pOne->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar14 = pOne->pObjs + iVar1;
      if ((int)pGVar14[-(ulong)((uint)*(undefined8 *)pGVar14 & 0x1fffffff)].Value < 0)
      goto LAB_003acf1c;
      pGVar14->Value =
           (uint)*(undefined8 *)pGVar14 >> 0x1d & 1 ^
           pGVar14[-(ulong)((uint)*(undefined8 *)pGVar14 & 0x1fffffff)].Value;
      lVar17 = lVar17 + 1;
    } while (lVar16 != lVar17);
  }
  lVar16 = (long)pTwo->vCos->nSize;
  if (0 < lVar16) {
    piVar5 = pTwo->vCos->pArray;
    lVar17 = 0;
    do {
      iVar1 = piVar5[lVar17];
      if (((long)iVar1 < 0) || (iVar6 <= iVar1)) goto LAB_003acebf;
      if (pTwo->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar14 = pTwo->pObjs + iVar1;
      if ((int)pGVar14[-(ulong)((uint)*(undefined8 *)pGVar14 & 0x1fffffff)].Value < 0) {
LAB_003acf1c:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      pGVar14->Value =
           (uint)*(undefined8 *)pGVar14 >> 0x1d & 1 ^
           pGVar14[-(ulong)((uint)*(undefined8 *)pGVar14 & 0x1fffffff)].Value;
      lVar17 = lVar17 + 1;
    } while (lVar16 != lVar17);
  }
  pVVar10 = pOne->vCos;
  iVar6 = pVVar10->nSize;
  if (Type == 0) {
    if (0 < iVar6) {
      lVar16 = 0;
      do {
        iVar1 = pVVar10->pArray[lVar16];
        if (((long)iVar1 < 0) || (pOne->nObjs <= iVar1)) goto LAB_003acebf;
        if ((long)iVar6 <= lVar16 + 1) goto LAB_003acede;
        iVar6 = pVVar10->pArray[lVar16 + 1];
        if ((iVar6 < 0) || (pOne->nObjs <= iVar6)) goto LAB_003acebf;
        lVar17 = (long)pTwo->vCos->nSize;
        if (lVar17 <= lVar16) goto LAB_003acede;
        piVar5 = pTwo->vCos->pArray;
        iVar6 = piVar5[lVar16];
        if (((long)iVar6 < 0) || (pTwo->nObjs <= iVar6)) goto LAB_003acebf;
        if (lVar17 <= lVar16 + 1) goto LAB_003acede;
        iVar3 = piVar5[lVar16 + 1];
        if ((iVar3 < 0) || (pTwo->nObjs <= iVar3)) goto LAB_003acebf;
        uVar7 = pTwo->pObjs[iVar6].Value;
        Gia_ManAppendCo(p,pOne->pObjs[iVar1].Value);
        Gia_ManAppendCo(p,uVar7);
        lVar16 = lVar16 + 2;
        pVVar10 = pOne->vCos;
        iVar6 = pVVar10->nSize;
      } while ((int)lVar16 < iVar6);
    }
  }
  else if (Type == 1) {
    if (0 < iVar6) {
      lVar16 = 0;
      do {
        iVar1 = pVVar10->pArray[lVar16];
        if ((iVar1 < 0) || (pOne->nObjs <= iVar1)) {
LAB_003acebf:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((long)iVar6 <= lVar16 + 1) {
LAB_003acede:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar6 = pVVar10->pArray[lVar16 + 1];
        if (((long)iVar6 < 0) || (pOne->nObjs <= iVar6)) goto LAB_003acebf;
        lVar17 = (long)pTwo->vCos->nSize;
        if (lVar17 <= lVar16) goto LAB_003acede;
        piVar5 = pTwo->vCos->pArray;
        iVar1 = piVar5[lVar16];
        if ((iVar1 < 0) || (pTwo->nObjs <= iVar1)) goto LAB_003acebf;
        if (lVar17 <= lVar16 + 1) goto LAB_003acede;
        iVar1 = piVar5[lVar16 + 1];
        if (((long)iVar1 < 0) || (pTwo->nObjs <= iVar1)) goto LAB_003acebf;
        uVar7 = pTwo->pObjs[iVar1].Value;
        Gia_ManAppendCo(p,pOne->pObjs[iVar6].Value);
        Gia_ManAppendCo(p,uVar7);
        lVar16 = lVar16 + 2;
        pVVar10 = pOne->vCos;
        iVar6 = pVVar10->nSize;
      } while ((int)lVar16 < iVar6);
    }
  }
  else if (0 < iVar6) {
    lVar16 = 0;
    do {
      iVar1 = pVVar10->pArray[lVar16];
      if (((long)iVar1 < 0) || (pOne->nObjs <= iVar1)) goto LAB_003acebf;
      local_38 = pOne->pObjs[iVar1].Value;
      if ((long)iVar6 <= lVar16 + 1) goto LAB_003acede;
      iVar6 = pVVar10->pArray[lVar16 + 1];
      if (((long)iVar6 < 0) || (pOne->nObjs <= iVar6)) goto LAB_003acebf;
      local_34 = pOne->pObjs[iVar6].Value;
      lVar17 = (long)pTwo->vCos->nSize;
      if (lVar17 <= lVar16) goto LAB_003acede;
      piVar5 = pTwo->vCos->pArray;
      iVar6 = piVar5[lVar16];
      if (((long)iVar6 < 0) || (pTwo->nObjs <= iVar6)) goto LAB_003acebf;
      local_40 = pTwo->pObjs[iVar6].Value;
      if (lVar17 <= lVar16 + 1) goto LAB_003acede;
      iVar6 = piVar5[lVar16 + 1];
      if (((long)iVar6 < 0) || (pTwo->nObjs <= iVar6)) goto LAB_003acebf;
      local_3c = pTwo->pObjs[iVar6].Value;
      iVar6 = Gia_ManDualCompare(p,(int *)&local_38,(int *)&local_40);
      Gia_ManAppendCo(p,iVar6);
      lVar16 = lVar16 + 2;
      pVVar10 = pOne->vCos;
      iVar6 = pVVar10->nSize;
    } while ((int)lVar16 < iVar6);
  }
  Gia_ManHashStop(p);
  pGVar11 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar11;
}

Assistant:

Gia_Man_t * Acb_NtkGiaDeriveMiter( Gia_Man_t * pOne, Gia_Man_t * pTwo, int Type )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManCiNum(pOne) == Gia_ManCiNum(pTwo) );
    assert( Gia_ManCoNum(pOne) == Gia_ManCoNum(pTwo) );
    pNew = Gia_ManStart( Gia_ManObjNum(pOne) + Gia_ManObjNum(pTwo) + 5*Gia_ManCoNum(pOne)/2 );
    pNew->pName = Abc_UtilStrsav( "miter" );
    pNew->pSpec = NULL;
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(pOne)->Value = 0;
    Gia_ManConst0(pTwo)->Value = 0;
    Gia_ManForEachCi( pOne, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachCi( pTwo, pObj, i )
        pObj->Value = Gia_ManCi(pOne, i)->Value;
    Gia_ManForEachAnd( pOne, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachAnd( pTwo, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pOne, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachCo( pTwo, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    if ( Type == 0 ) // only main circuit
    {
        for ( i = 0; i < Gia_ManCoNum(pOne); i += 2 )
        {
            int pLitsF[2] = { Gia_ManCo(pOne, i)->Value, Gia_ManCo(pOne, i+1)->Value };
            int pLitsS[2] = { Gia_ManCo(pTwo, i)->Value, Gia_ManCo(pTwo, i+1)->Value };
            Gia_ManAppendCo( pNew, pLitsF[0] );
            Gia_ManAppendCo( pNew, pLitsS[0] );
        }
    }
    else if ( Type == 1 ) // only shadow circuit
    {
        for ( i = 0; i < Gia_ManCoNum(pOne); i += 2 )
        {
            int pLitsF[2] = { Gia_ManCo(pOne, i)->Value, Gia_ManCo(pOne, i+1)->Value };
            int pLitsS[2] = { Gia_ManCo(pTwo, i)->Value, Gia_ManCo(pTwo, i+1)->Value };
            Gia_ManAppendCo( pNew, pLitsF[1] );
            Gia_ManAppendCo( pNew, pLitsS[1] );
        }
    }
    else // comparator of the two
    {
        for ( i = 0; i < Gia_ManCoNum(pOne); i += 2 )
        {
            int pLitsF[2] = { Gia_ManCo(pOne, i)->Value, Gia_ManCo(pOne, i+1)->Value };
            int pLitsS[2] = { Gia_ManCo(pTwo, i)->Value, Gia_ManCo(pTwo, i+1)->Value };
            Gia_ManAppendCo( pNew, Gia_ManDualCompare( pNew, pLitsF, pLitsS ) );
        }
    }
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}